

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa-verify.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  ostream *poVar2;
  undefined8 uVar3;
  streambuf *psVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  string local_c28 [32];
  string local_c08 [39];
  allocator_type local_be1;
  undefined1 local_be0 [8];
  vector<char,_std::allocator<char>_> cstr;
  string local_bc0 [32];
  stringstream local_ba0 [8];
  stringstream ss_2;
  ostream local_b90 [383];
  allocator<char> local_a11;
  string local_a10 [8];
  string ascFilename;
  stringstream local_9d0 [8];
  stringstream ss_1;
  ostream local_9c0 [376];
  string local_848 [32];
  stringstream local_828 [8];
  stringstream ss;
  ostream local_818 [376];
  undefined1 local_6a0 [8];
  ifstream ascFile;
  undefined1 local_498 [8];
  ifstream textFile;
  undefined1 local_280 [8];
  ifstream keyFile;
  string local_78 [8];
  string asc;
  string plain;
  string key;
  char **argv_local;
  int argc_local;
  
  if (argc < 3) {
    poVar2 = std::operator<<((ostream *)&std::cout,"VerifyRSA - https://github.com/rodlie/verifyrsa"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Usage: rsa-verify <public key> <text file>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 0;
  }
  else {
    std::__cxx11::string::string((string *)(plain.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(asc.field_2._M_local_buf + 8));
    std::__cxx11::string::string(local_78);
    std::ifstream::ifstream(local_280);
    std::ifstream::ifstream(local_498);
    std::ifstream::ifstream(local_6a0);
    std::ifstream::open(local_280,argv[1],8);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_828);
      psVar4 = (streambuf *)std::ifstream::rdbuf();
      std::ostream::operator<<(local_818,psVar4);
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator=((string *)(plain.field_2._M_local_buf + 8),local_848);
      std::__cxx11::string::~string(local_848);
      std::ifstream::close();
      std::__cxx11::stringstream::~stringstream(local_828);
    }
    std::ifstream::open(local_498,argv[2],8);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_9d0);
      psVar4 = (streambuf *)std::ifstream::rdbuf();
      std::ostream::operator<<(local_9c0,psVar4);
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator=
                ((string *)(asc.field_2._M_local_buf + 8),
                 (string *)(ascFilename.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(ascFilename.field_2._M_local_buf + 8));
      std::ifstream::close();
      std::__cxx11::stringstream::~stringstream(local_9d0);
    }
    pcVar6 = argv[2];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_a10,pcVar6,&local_a11);
    std::allocator<char>::~allocator(&local_a11);
    std::__cxx11::string::append((char *)local_a10);
    uVar3 = std::__cxx11::string::c_str();
    std::ifstream::open(local_6a0,uVar3,8);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_ba0);
      psVar4 = (streambuf *)std::ifstream::rdbuf();
      std::ostream::operator<<(local_b90,psVar4);
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator=(local_78,local_bc0);
      std::__cxx11::string::~string(local_bc0);
      std::ifstream::close();
      std::__cxx11::stringstream::~stringstream(local_ba0);
    }
    uVar5 = std::__cxx11::string::empty();
    if ((((uVar5 & 1) == 0) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) &&
       (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
      pcVar6 = (char *)std::__cxx11::string::c_str();
      lVar7 = std::__cxx11::string::c_str();
      lVar8 = std::__cxx11::string::size();
      std::allocator<char>::allocator();
      std::vector<char,std::allocator<char>>::vector<char_const*,void>
                ((vector<char,std::allocator<char>> *)local_be0,pcVar6,(char *)(lVar7 + 1 + lVar8),
                 &local_be1);
      std::allocator<char>::~allocator(&local_be1);
      std::__cxx11::string::string(local_c08,(string *)(plain.field_2._M_local_buf + 8));
      std::__cxx11::string::string(local_c28,(string *)(asc.field_2._M_local_buf + 8));
      pcVar6 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)local_be0);
      bVar1 = VerifyRSA::verify(local_c08,local_c28,pcVar6);
      std::__cxx11::string::~string(local_c28);
      std::__cxx11::string::~string(local_c08);
      bVar9 = ((bVar1 ^ 0xff) & 1) != 0;
      if (bVar9) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Bad signature!");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"Valid signature!");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      argv_local._4_4_ = (uint)bVar9;
      cstr.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 1;
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_be0);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Missing key, text or asc.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 1;
      cstr.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 1;
    }
    std::__cxx11::string::~string(local_a10);
    std::ifstream::~ifstream(local_6a0);
    std::ifstream::~ifstream(local_498);
    std::ifstream::~ifstream(local_280);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string((string *)(asc.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(plain.field_2._M_local_buf + 8));
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]) {
    if (argc<3) {
        std::cout << "VerifyRSA - https://github.com/rodlie/verifyrsa" << std::endl;
        std::cout << "" << std::endl;
        std::cout << "Usage: rsa-verify <public key> <text file>" << std::endl;
        return 0;
    }

    std::string key, plain, asc;
    std::ifstream keyFile, textFile, ascFile;
    keyFile.open(argv[1]);
    if (keyFile.is_open()) {
        std::stringstream ss;
        ss << keyFile.rdbuf();
        key = ss.str();
        keyFile.close();
    }
    textFile.open(argv[2]);
    if (textFile.is_open()) {
        std::stringstream ss;
        ss << textFile.rdbuf();
        plain = ss.str();
        textFile.close();
    }
    std::string ascFilename = argv[2];
    ascFilename.append(".asc");
    ascFile.open(ascFilename.c_str());
    if (ascFile.is_open()) {
        std::stringstream ss;
        ss << ascFile.rdbuf();
        asc = ss.str();
        ascFile.close();
    }

    if (key.empty() || plain.empty() || asc.empty()) {
        std::cerr << "Missing key, text or asc." << std::endl;
        return 1;
    }
    
    std::vector<char> cstr(asc.c_str(), asc.c_str() + asc.size() + 1);
    if (!VerifyRSA::verify(key, plain, cstr.data())) {
        std::cerr << "Bad signature!" << std::endl;
        return 1;
    }
    std::cout << "Valid signature!" << std::endl;
    return 0;
}